

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O3

void __thiscall
nuraft::peer::send_req(peer *this,ptr<peer> *myself,ptr<req_msg> *req,rpc_handler *handler)

{
  mutex *__mutex;
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  msg_type type;
  ptr<rpc_client> rpc_local;
  ptr<rpc_result> pending;
  shared_ptr<nuraft::rpc_client> local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
  local_a8;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  peer *local_48;
  element_type *local_38;
  
  if (((this->abandoned_)._M_base._M_i & 1U) == 0) {
    if ((((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) &&
        (peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar3 != (element_type *)0x0)) && (iVar9 = (*peVar3->_vptr_logger[7])(), 5 < iVar9)) {
      local_38 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar4 = (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = (peVar4->super_msg_base).src_;
      uVar2 = (peVar4->super_msg_base).dst_;
      msg_type_to_string_abi_cxx11_
                ((string *)local_c8,(nuraft *)(ulong)(peVar4->super_msg_base).type_,type);
      msg_if_given_abi_cxx11_
                ((string *)local_98,"send req %d -> %d, type %s",(ulong)uVar1,(ulong)uVar2,
                 local_c8._0_8_);
      (*local_38->_vptr_logger[8])
                (local_38,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"send_req",0x2c,local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
      if ((undefined1 *)local_c8._0_8_ != local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    local_a8.
    super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>,std::allocator<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&>
              (&local_a8.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>
                **)&local_a8,
               (allocator<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
                *)local_98,handler);
    local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __mutex = &this->rpc_protector_;
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar9 == 0) {
      peVar5 = (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar5 == (element_type *)0x0) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 5 < iVar9)) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)local_98,"rpc local is null");
          (*peVar3->_vptr_logger[8])
                    (peVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                     ,"send_req",0x35,local_98);
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_);
          }
        }
        LOCK();
        (this->busy_flag_)._M_base._M_i = false;
        UNLOCK();
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        local_98._0_8_ = handle_rpc_result;
        local_98._8_8_ = 0;
        std::
        _Tuple_impl<1ul,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>>
        ::
        _Tuple_impl<std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                  ((_Tuple_impl<1ul,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>>
                    *)(local_98 + 0x10),myself,&local_d8,req,&local_a8,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2);
        local_c8._8_8_ = 0;
        local_48 = this;
        local_c8._0_8_ = operator_new(0x58);
        uVar8 = uStack_60;
        uVar7 = uStack_70;
        uVar6 = local_88._8_8_;
        *(undefined8 *)local_c8._0_8_ = local_98._0_8_;
        *(undefined8 *)(local_c8._0_8_ + 8) = local_98._8_8_;
        local_88._8_8_ = 0;
        *(size_type *)(local_c8._0_8_ + 0x10) = local_88._M_allocated_capacity;
        *(undefined8 *)(local_c8._0_8_ + 0x18) = uVar6;
        local_88._M_allocated_capacity = 0;
        uStack_70 = 0;
        *(undefined8 *)(local_c8._0_8_ + 0x20) = local_78;
        *(undefined8 *)(local_c8._0_8_ + 0x28) = uVar7;
        local_78 = 0;
        uStack_60 = 0;
        *(undefined8 *)(local_c8._0_8_ + 0x30) = local_68;
        *(undefined8 *)(local_c8._0_8_ + 0x38) = uVar8;
        local_68 = 0;
        *(undefined4 *)(local_c8._0_8_ + 0x40) = local_58;
        *(undefined4 *)(local_c8._0_8_ + 0x44) = uStack_54;
        *(undefined4 *)(local_c8._0_8_ + 0x48) = uStack_50;
        *(undefined4 *)(local_c8._0_8_ + 0x4c) = uStack_4c;
        *(peer **)(local_c8._0_8_ + 0x50) = this;
        local_b8._8_8_ =
             std::
             _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
             ::_M_invoke;
        local_b8._0_8_ =
             std::
             _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
             ::_M_manager;
        if ((local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
             (element_type *)0x0) ||
           ((*(local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_rpc_client[2])
                      (local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,req,local_c8,0), (code *)local_b8._0_8_ != (code *)0x0)) {
          (*(code *)local_b8._0_8_)(local_c8,local_c8,3);
        }
      }
      if (local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_a8.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.
                   super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    std::__throw_system_error(iVar9);
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    return;
  }
  iVar9 = (*peVar3->_vptr_logger[7])();
  if (iVar9 < 2) {
    return;
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  msg_if_given_abi_cxx11_
            ((string *)local_98,"peer %d has been shut down, cannot send request",
             (ulong)(uint)((this->config_).
                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->id_);
  (*peVar3->_vptr_logger[8])
            (peVar3,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
             ,"send_req",0x24,(string *)local_98);
  if ((undefined1 *)local_98._0_8_ == local_98 + 0x10) {
    return;
  }
  operator_delete((void *)local_98._0_8_);
  return;
}

Assistant:

void peer::send_req( ptr<peer> myself,
                     ptr<req_msg>& req,
                     rpc_handler& handler )
{
    if (abandoned_) {
        p_er("peer %d has been shut down, cannot send request",
             config_->get_id());
        return;
    }

    if (req) {
        p_tr("send req %d -> %d, type %s",
             req->get_src(),
             req->get_dst(),
             msg_type_to_string( req->get_type() ).c_str() );
    }

    ptr<rpc_result> pending = cs_new<rpc_result>(handler);
    ptr<rpc_client> rpc_local = nullptr;
    {   std::lock_guard<std::mutex> l(rpc_protector_);
        if (!rpc_) {
            // Nothing will be sent, immediately free it
            // to serve next operation.
            p_tr("rpc local is null");
            set_free();
            return;
        }
        rpc_local = rpc_;
    }
    rpc_handler h = (rpc_handler)std::bind
                    ( &peer::handle_rpc_result,
                      this,
                      myself,
                      rpc_local,
                      req,
                      pending,
                      std::placeholders::_1,
                      std::placeholders::_2 );
    if (rpc_local) {
        rpc_local->send(req, h);
    }
}